

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

QRgbaFloat32 *
qt_fetch_radial_gradient_rgbfp
          (QRgbaFloat32 *buffer,Operator *op,QSpanData *data,int y,int x,int length)

{
  double dVar1;
  double dVar2;
  QRgbaFloat32 *pQVar3;
  QRgbaFloat32 *end;
  ulong uVar4;
  double dVar5;
  undefined8 uVar6;
  double dVar7;
  double dVar8;
  undefined8 uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  Type TVar17;
  
  dVar1 = (op->field_16).radial.a;
  uVar4 = -(ulong)(dVar1 < -dVar1);
  if ((double)(~uVar4 & (ulong)dVar1 | (ulong)-dVar1 & uVar4) <= 1e-12) {
LAB_00658162:
    (*qt_memfill64)((quint64 *)buffer,0,(long)length);
  }
  else {
    dVar8 = (double)y + 0.5;
    dVar5 = (double)x + 0.5;
    dVar16 = data->m11;
    dVar2 = data->m12;
    dVar14 = dVar5 * dVar16 + dVar8 * data->m21 + data->dx;
    dVar15 = dVar5 * dVar2 + dVar8 * data->m22 + data->dy;
    dVar7 = data->m13;
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      end = buffer + length;
      dVar13 = 1.0 / (dVar1 + dVar1);
    }
    else {
      end = buffer + length;
      dVar13 = 1.0 / (dVar1 + dVar1);
      if ((data->m23 == 0.0) && (!NAN(data->m23))) {
        dVar14 = dVar14 - *(double *)((long)&data->field_23 + 0x20);
        dVar15 = dVar15 - *(double *)((long)&data->field_23 + 0x28);
        dVar7 = (op->field_16).linear.dx;
        dVar8 = (op->field_16).linear.dy;
        dVar11 = dVar15 * dVar8 +
                 (op->field_16).linear.l * *(double *)((long)&data->field_23 + 0x30) +
                 dVar14 * dVar7;
        dVar11 = dVar11 + dVar11;
        dVar1 = dVar1 * 4.0;
        dVar10 = dVar13 * dVar13;
        dVar5 = (dVar11 * dVar11 -
                ((op->field_16).linear.off - (dVar14 * dVar14 + dVar15 * dVar15)) * dVar1) * dVar10;
        if ((uint)ABS((float)dVar5) < 0x7f800000) {
          dVar8 = dVar7 * dVar16 + dVar8 * dVar2;
          dVar8 = dVar8 + dVar8;
          dVar12 = dVar16 * dVar16 + dVar2 * dVar2;
          dVar7 = dVar2 * dVar15 + dVar14 * dVar16;
          dVar7 = ((dVar7 + dVar7 + dVar12) * dVar1 + dVar8 * dVar8 + (dVar11 + dVar11) * dVar8) *
                  dVar10;
          if (((uint)ABS((float)dVar7) < 0x7f800000) &&
             (dVar10 = dVar10 * (dVar1 * (dVar12 + dVar12) + (dVar8 + dVar8) * dVar8),
             (uint)ABS((float)dVar10) < 0x7f800000)) {
            RadialFetchPlain<GradientBaseFP>::fetch
                      (buffer,end,op,data,dVar5,dVar7,dVar10,dVar11 * dVar13,dVar8 * dVar13);
            return buffer;
          }
        }
        goto LAB_00658162;
      }
    }
    if (buffer < end) {
      dVar1 = dVar7 * dVar5 + dVar8 * data->m23 + data->m33;
      pQVar3 = buffer;
      do {
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          dVar7 = dVar14 * (1.0 / dVar1) - *(double *)((long)&data->field_23 + 0x20);
          dVar8 = dVar15 * (1.0 / dVar1) - *(double *)((long)&data->field_23 + 0x28);
          dVar16 = (op->field_16).linear.dy * dVar8 +
                   (op->field_16).linear.l * *(double *)((long)&data->field_23 + 0x30) +
                   (op->field_16).linear.dx * dVar7;
          dVar16 = dVar16 + dVar16;
          dVar7 = dVar16 * dVar16 +
                  (op->field_16).radial.a * -4.0 *
                  ((op->field_16).linear.off - (dVar7 * dVar7 + dVar8 * dVar8));
          uVar6 = 0;
          if (dVar7 < 0.0) {
            uVar9 = 0;
          }
          else {
            if (dVar7 < 0.0) {
              dVar7 = sqrt(dVar7);
            }
            else {
              dVar7 = SQRT(dVar7);
            }
            uVar6 = 0;
            dVar8 = (-dVar16 - dVar7) * dVar13;
            dVar7 = (dVar7 - dVar16) * dVar13;
            if (dVar7 <= dVar8) {
              dVar7 = dVar8;
            }
            uVar9 = 0;
            if (0.0 <= (op->field_16).linear.l * dVar7 + *(double *)((long)&data->field_23 + 0x30))
            {
              TVar17 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,dVar7);
              uVar6 = TVar17._8_8_;
              uVar9 = TVar17._0_8_;
            }
          }
          pQVar3->r = (float)(int)uVar9;
          pQVar3->g = (float)(int)((ulong)uVar9 >> 0x20);
          pQVar3->b = (float)(int)uVar6;
          pQVar3->a = (float)(int)((ulong)uVar6 >> 0x20);
        }
        else {
          pQVar3->r = 0.0;
          pQVar3->g = 0.0;
          pQVar3->b = 0.0;
          pQVar3->a = 0.0;
        }
        dVar14 = dVar14 + data->m11;
        dVar15 = dVar15 + data->m12;
        dVar1 = dVar1 + data->m13;
        pQVar3 = pQVar3 + 1;
      } while (pQVar3 < end);
    }
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 * QT_FASTCALL qt_fetch_radial_gradient_rgbfp(QRgbaFloat32 *buffer, const Operator *op, const QSpanData *data,
                                                                   int y, int x, int length)
{
    return qt_fetch_radial_gradient_template<RadialFetchPlain<GradientBaseFP>, QRgbaFloat32>(buffer, op, data, y, x, length);
}